

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

uint8_t IT8951_Init(void)

{
  uint16_t uVar1;
  int iVar2;
  uint8_t local_9;
  
  iVar2 = bcm2835_init();
  if (iVar2 == 0) {
    printf("bcm2835_init error \n");
    local_9 = '\x01';
  }
  else {
    bcm2835_spi_begin();
    bcm2835_spi_setBitOrder('\x01');
    bcm2835_spi_setDataMode('\0');
    bcm2835_spi_setClockDivider(0x20);
    bcm2835_gpio_fsel('\b','\x01');
    bcm2835_gpio_fsel('\x18','\0');
    bcm2835_gpio_fsel('\x11','\x01');
    bcm2835_gpio_write('\b','\x01');
    printf("****** IT8951 ******\n");
    bcm2835_gpio_write('\x11','\0');
    bcm2835_delay(100);
    bcm2835_gpio_write('\x11','\x01');
    GetIT8951SystemInfo(&gstI80DevInfo);
    gpFrameBuf = (uint8_t *)
                 malloc((long)(int)((uint)gstI80DevInfo.usPanelW * (uint)gstI80DevInfo.usPanelH));
    if (gpFrameBuf == (uint8_t *)0x0) {
      perror("malloc error!\n");
      local_9 = '\x01';
    }
    else {
      gulImgBufAddr = CONCAT22(gstI80DevInfo.usImgBufAddrH,gstI80DevInfo.usImgBufAddrL);
      IT8951WriteReg(4,1);
      uVar1 = IT8951GetVCOM();
      if (uVar1 != 0x5dc) {
        IT8951SetVCOM(0x5dc);
        uVar1 = IT8951GetVCOM();
        printf("VCOM = -%.02fV\n",(double)((float)uVar1 / 1000.0));
      }
      local_9 = '\0';
    }
  }
  return local_9;
}

Assistant:

uint8_t IT8951_Init()
{
	if (!bcm2835_init()) 
	{
		printf("bcm2835_init error \n");
		return 1;
	}
	
	bcm2835_spi_begin();
	bcm2835_spi_setBitOrder(BCM2835_SPI_BIT_ORDER_MSBFIRST);   		//default
	bcm2835_spi_setDataMode(BCM2835_SPI_MODE0);               		//default
	bcm2835_spi_setClockDivider(BCM2835_SPI_CLOCK_DIVIDER_32);		//default
	
	bcm2835_gpio_fsel(CS, BCM2835_GPIO_FSEL_OUTP);  
	bcm2835_gpio_fsel(HRDY, BCM2835_GPIO_FSEL_INPT);
	bcm2835_gpio_fsel(RESET, BCM2835_GPIO_FSEL_OUTP);
	
	bcm2835_gpio_write(CS, HIGH);

	printf("****** IT8951 ******\n");
	
	bcm2835_gpio_write(RESET, LOW);
	bcm2835_delay(100);
	bcm2835_gpio_write(RESET, HIGH);

	//Get Device Info
	GetIT8951SystemInfo(&gstI80DevInfo);
	
	gpFrameBuf = malloc(gstI80DevInfo.usPanelW * gstI80DevInfo.usPanelH);
	if (!gpFrameBuf)
	{
		perror("malloc error!\n");
		return 1;
	}
	
 	gulImgBufAddr = gstI80DevInfo.usImgBufAddrL | (gstI80DevInfo.usImgBufAddrH << 16);
 	
 	//Set to Enable I80 Packed mode
 	IT8951WriteReg(I80CPCR, 0x0001);

	if (VCOM != IT8951GetVCOM())
	{
		IT8951SetVCOM(VCOM);
		printf("VCOM = -%.02fV\n",(float)IT8951GetVCOM()/1000);
	}
	
	return 0;
}